

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O2

int mz_zip_reader_locate_file(mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  mz_uint mVar4;
  mz_zip_internal_state *pmVar5;
  void *pvVar6;
  void *pvVar7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  size_t sVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  byte bVar21;
  byte bVar22;
  ulong uVar23;
  int iVar24;
  void *local_58;
  size_t local_48;
  
  if (((pZip == (mz_zip_archive *)0x0) ||
      (pmVar5 = pZip->m_pState, pName == (char *)0x0 || pmVar5 == (mz_zip_internal_state *)0x0)) ||
     (pZip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    uVar23 = 0xffffffff;
    goto LAB_0012bcc0;
  }
  if ((pComment == (char *)0x0 && (flags & 0x300) == 0) &&
     (pvVar6 = (pmVar5->m_sorted_central_dir_offsets).m_p, pvVar6 != (void *)0x0)) {
    mVar4 = pZip->m_total_files;
    sVar10 = strlen(pName);
    iVar9 = mVar4 - 1;
    iVar12 = 0;
    while (iVar24 = iVar9, iVar12 <= iVar24) {
      uVar13 = (uint)(iVar12 + iVar24) >> 1;
      uVar23 = (ulong)*(uint *)((long)pvVar6 + (ulong)uVar13 * 4);
      pvVar7 = (pmVar5->m_central_dir).m_p;
      uVar20 = (ulong)*(uint *)((long)(pmVar5->m_central_dir_offsets).m_p + uVar23 * 4);
      uVar3 = *(ushort *)((long)pvVar7 + uVar20 + 0x1c);
      uVar17 = (ulong)uVar3;
      if ((uint)sVar10 <= (uint)uVar3) {
        uVar17 = sVar10 & 0xffffffff;
      }
      bVar21 = 0;
      for (uVar18 = 0; pbVar1 = (byte *)((long)pvVar7 + uVar18 + uVar20 + 0x2e), bVar22 = bVar21,
          pbVar1 < (byte *)((long)pvVar7 + uVar17 + uVar20 + 0x2e); uVar18 = uVar18 + 1) {
        bVar22 = *pbVar1;
        bVar21 = bVar22 + 0x20;
        if (0x19 < (byte)(bVar22 + 0xbf)) {
          bVar21 = bVar22;
        }
        bVar2 = pName[uVar18];
        bVar22 = bVar2 + 0x20;
        if (0x19 < (byte)(bVar2 + 0xbf)) {
          bVar22 = bVar2;
        }
        if (bVar21 != bVar22) break;
      }
      iVar19 = (uint)bVar21 - (uint)bVar22;
      if (uVar17 == uVar18) {
        iVar19 = (uint)uVar3 - (uint)sVar10;
      }
      if (iVar19 == 0) goto LAB_0012bcc0;
      iVar9 = uVar13 - 1;
      if (iVar19 < 0) {
        iVar9 = iVar24;
        iVar12 = uVar13 + 1;
      }
    }
  }
  else {
    sVar10 = strlen(pName);
    if (sVar10 < 0x10000) {
      if (pComment == (char *)0x0) {
        local_48 = 0;
      }
      else {
        local_48 = strlen(pComment);
        if (0xffff < local_48) goto LAB_0012bd0f;
      }
      uVar13 = pZip->m_total_files;
      for (uVar23 = 0; uVar23 != uVar13; uVar23 = uVar23 + 1) {
        pvVar6 = (pmVar5->m_central_dir).m_p;
        uVar20 = (ulong)*(uint *)((long)(pmVar5->m_central_dir_offsets).m_p + uVar23 * 4);
        uVar3 = *(ushort *)((long)pvVar6 + uVar20 + 0x1c);
        uVar17 = (ulong)uVar3;
        if (sVar10 <= uVar17) {
          local_58 = (void *)((long)pvVar6 + uVar20 + 0x2e);
          if (local_48 == 0) {
LAB_0012be1b:
            if (((flags >> 9 & 1) != 0) && (uVar3 != 0)) {
              do {
                uVar14 = *(byte *)((long)pvVar6 + uVar17 + uVar20 + 0x2d) - 0x2f;
                if ((uVar14 < 0x2e) && ((0x200000000801U >> ((ulong)uVar14 & 0x3f) & 1) != 0))
                goto LAB_0012be5f;
                bVar8 = 1 < (long)uVar17;
                uVar17 = uVar17 - 1;
              } while (bVar8);
              uVar17 = 0;
LAB_0012be5f:
              local_58 = (void *)((long)local_58 + (uVar17 & 0xffffffff));
              uVar17 = (ulong)((uint)uVar3 - (int)uVar17);
            }
            if (sVar10 == uVar17) {
              if ((flags >> 8 & 1) == 0) {
                sVar11 = 0;
                do {
                  if (sVar10 == sVar11) goto LAB_0012bcc0;
                  bVar21 = pName[sVar11];
                  iVar9 = bVar21 + 0x20;
                  if (0x19 < (byte)(bVar21 + 0xbf)) {
                    iVar9 = (int)(char)bVar21;
                  }
                  bVar21 = *(byte *)((long)local_58 + sVar11);
                  iVar12 = bVar21 + 0x20;
                  if (0x19 < (byte)(bVar21 + 0xbf)) {
                    iVar12 = (int)(char)bVar21;
                  }
                  sVar11 = sVar11 + 1;
                } while (iVar9 == iVar12);
              }
              else {
                iVar9 = bcmp(pName,local_58,sVar10);
                if (iVar9 == 0) goto LAB_0012bcc0;
              }
            }
          }
          else {
            uVar18 = (ulong)*(ushort *)((long)pvVar6 + uVar20 + 0x20);
            if (local_48 == uVar18) {
              uVar16 = (ulong)*(ushort *)((long)pvVar6 + uVar20 + 0x1e);
              if ((flags >> 8 & 1) == 0) {
                uVar15 = 0;
                do {
                  if (uVar18 == uVar15) goto LAB_0012be1b;
                  bVar21 = pComment[uVar15];
                  iVar9 = bVar21 + 0x20;
                  if (0x19 < (byte)(bVar21 + 0xbf)) {
                    iVar9 = (int)(char)bVar21;
                  }
                  bVar21 = *(byte *)((long)pvVar6 + uVar15 + uVar16 + uVar20 + uVar17 + 0x2e);
                  iVar12 = bVar21 + 0x20;
                  if (0x19 < (byte)(bVar21 + 0xbf)) {
                    iVar12 = (int)(char)bVar21;
                  }
                  uVar15 = uVar15 + 1;
                } while (iVar9 == iVar12);
              }
              else {
                iVar9 = bcmp(pComment,(void *)((long)local_58 + uVar16 + uVar17),local_48);
                if (iVar9 == 0) goto LAB_0012be1b;
              }
            }
          }
        }
      }
      uVar23 = 0xffffffff;
      goto LAB_0012bcc0;
    }
  }
LAB_0012bd0f:
  uVar23 = 0xffffffff;
LAB_0012bcc0:
  return (int)uVar23;
}

Assistant:

int mz_zip_reader_locate_file(mz_zip_archive* pZip, const char* pName, const char* pComment, mz_uint flags) {
  mz_uint file_index;
  size_t name_len, comment_len;
  if ((!pZip) || (!pZip->m_pState) || (!pName) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING))
    return -1;
  if (((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) && (!pComment) && (pZip->m_pState->m_sorted_central_dir_offsets.m_p))
    return mz_zip_reader_locate_file_binary_search(pZip, pName);
  name_len = strlen(pName);
  if (name_len > 0xFFFF)
    return -1;
  comment_len = pComment ? strlen(pComment) : 0;
  if (comment_len > 0xFFFF)
    return -1;
  for (file_index = 0; file_index < pZip->m_total_files; file_index++) {
    const mz_uint8* pHeader = &MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir, mz_uint8, MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index));
    mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    const char* pFilename = (const char*)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
    if (filename_len < name_len)
      continue;
    if (comment_len) {
      mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS), file_comment_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
      const char* pFile_comment = pFilename + filename_len + file_extra_len;
      if ((file_comment_len != comment_len) || (!mz_zip_reader_string_equal(pComment, pFile_comment, file_comment_len, flags)))
        continue;
    }
    if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len)) {
      int ofs = filename_len - 1;
      do {
        if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') || (pFilename[ofs] == ':'))
          break;
      } while (--ofs >= 0);
      ofs++;
      pFilename += ofs;
      filename_len -= ofs;
    }
    if ((filename_len == name_len) && (mz_zip_reader_string_equal(pName, pFilename, filename_len, flags)))
      return file_index;
  }
  return -1;
}